

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_boost::python::str,_boost::python::str,_boost::python::list_&>_>
::operator()(impl<void_(PythonModuleClient::*)(boost::python::str,_boost::python::str,_boost::python::list_&),_boost::python::default_call_policies,_boost::mpl::vector5<void,_PythonModuleClient_&,_boost::python::str,_boost::python::str,_boost::python::list_&>_>
             *this,PyObject *args_,PyObject *param_2)

{
  int iVar1;
  PyObject *pPVar2;
  c_t3 c3;
  c_t2 c2;
  c_t1 c1;
  c_t0 c0;
  list local_38;
  PyTypeObject *local_30;
  Py_ssize_t local_28;
  long local_20;
  undefined4 local_14;
  
  local_20 = converter::get_lvalue_from_python
                       ((_object *)args_[1].ob_type,
                        converter::detail::registered_base<PythonModuleClient_const_volatile&>::
                        converters);
  if (local_20 != 0) {
    local_28 = args_[2].ob_refcnt;
    iVar1 = PyObject_IsInstance(local_28,&PyUnicode_Type);
    if (iVar1 != 0) {
      local_30 = args_[2].ob_type;
      iVar1 = PyObject_IsInstance(local_30,&PyUnicode_Type);
      if (iVar1 != 0) {
        local_38.super_list_base.super_object.super_object_base.m_ptr =
             (list_base)args_[3].ob_refcnt;
        *(long *)local_38.super_list_base.super_object.super_object_base.m_ptr =
             *(long *)local_38.super_list_base.super_object.super_object_base.m_ptr + 1;
        iVar1 = PyObject_IsInstance(local_38.super_list_base.super_object.super_object_base.m_ptr,
                                    &PyList_Type);
        if (iVar1 == 0) {
          pPVar2 = (PyObject *)0x0;
        }
        else {
          local_14 = 0;
          pPVar2 = invoke<int,void(PythonModuleClient::*)(boost::python::str,boost::python::str,boost::python::list&),boost::python::arg_from_python<PythonModuleClient&>,boost::python::arg_from_python<boost::python::str>,boost::python::arg_from_python<boost::python::str>,boost::python::arg_from_python<boost::python::list&>>
                             (&local_14,this,&local_20,&local_28,&local_30,&local_38);
        }
        value_destroyer<false>::execute<boost::python::list>(&local_38);
        return pPVar2;
      }
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }